

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VLinearCombination(int nvec,sunrealtype *c,N_Vector *X,N_Vector z)

{
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  SUNErrCode ier;
  int i;
  SUNErrCode local_28;
  int local_24;
  
  if (*(long *)(*(long *)(in_RCX + 8) + 0xf0) == 0) {
    (**(code **)(*(long *)(in_RCX + 8) + 0x78))(*in_RSI,*in_RDX,in_RCX);
    for (local_24 = 1; local_24 < in_EDI; local_24 = local_24 + 1) {
      (**(code **)(*(long *)(in_RCX + 8) + 0x58))
                (in_RSI[local_24],0x3ff0000000000000,in_RDX[local_24],in_RCX,in_RCX);
    }
    local_28 = 0;
  }
  else {
    local_28 = (**(code **)(*(long *)(in_RCX + 8) + 0xf0))(in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_28;
}

Assistant:

SUNErrCode N_VLinearCombination(int nvec, sunrealtype* c, N_Vector* X, N_Vector z)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (z->ops->nvlinearcombination != NULL)
  {
    ier = z->ops->nvlinearcombination(nvec, c, X, z);
  }
  else
  {
    z->ops->nvscale(c[0], X[0], z);
    for (i = 1; i < nvec; i++)
    {
      z->ops->nvlinearsum(c[i], X[i], SUN_RCONST(1.0), z, z);
    }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}